

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O0

void sequence_iterator_duplicate_test(void)

{
  int iVar1;
  fdb_status fVar2;
  size_t metalen;
  ulong uVar3;
  void *meta;
  fdb_kvs_handle *in_stack_fffffffffffff7d8;
  fdb_file_handle *in_stack_fffffffffffff7e0;
  fdb_iterator *in_stack_fffffffffffff7e8;
  void *in_stack_fffffffffffff7f0;
  fdb_doc **in_stack_fffffffffffff7f8;
  size_t in_stack_fffffffffffff800;
  fdb_doc **in_stack_fffffffffffff850;
  fdb_iterator *in_stack_fffffffffffff858;
  fdb_config *in_stack_fffffffffffff9f8;
  char *in_stack_fffffffffffffa00;
  fdb_file_handle **in_stack_fffffffffffffa08;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  ulong local_a0;
  fdb_seqnum_t seqnum;
  fdb_iterator *iterator;
  size_t *psStack_88;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int count;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  dbfile._4_4_ = 100;
  rdoc = (fdb_doc *)&stack0xfffffffffffff7d8;
  psStack_88 = (size_t *)0x0;
  count = system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.wal_flush_before_commit = true;
  fconfig.buffercache_size = 0x400;
  fconfig.flags._3_1_ = 0;
  fconfig.wal_threshold._4_4_ = 1;
  fdb_open(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  fdb_kvs_open_default
            (in_stack_fffffffffffff7e0,(fdb_kvs_handle **)in_stack_fffffffffffff7d8,
             (fdb_kvs_config *)0x113bf1);
  iterator._4_4_ =
       fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"sequence_iterator_test");
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x8c5);
    sequence_iterator_duplicate_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x8c5,"void sequence_iterator_duplicate_test()");
    }
  }
  for (n = 0; n < dbfile._4_4_; n = n + 1) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d(first)",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    meta = (void *)0x113d3e;
    metalen = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
                   (size_t)in_stack_fffffffffffff7d8,meta,metalen,(void *)0x113d75,
                   in_stack_fffffffffffff800);
    fdb_set((fdb_kvs_handle *)doc,(fdb_doc *)(&rdoc->keylen)[n]);
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff7d8,'\0');
  for (n = 0; n < dbfile._4_4_; n = n + 1) {
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d(second)",(ulong)(uint)n);
    strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_update(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                   (size_t)in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
                   (size_t)in_stack_fffffffffffff7d8);
    fdb_set((fdb_kvs_handle *)doc,(fdb_doc *)(&rdoc->keylen)[n]);
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff7d8,'\0');
  for (n = 0; n < dbfile._4_4_; n = n + 2) {
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d(third)",(ulong)(uint)n);
    strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_update(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
                   (size_t)in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
                   (size_t)in_stack_fffffffffffff7d8);
    fdb_set((fdb_kvs_handle *)doc,(fdb_doc *)(&rdoc->keylen)[n]);
  }
  fdb_commit((fdb_file_handle *)in_stack_fffffffffffff7d8,'\0');
  fdb_iterator_sequence_init((fdb_kvs_handle *)doc,(fdb_iterator **)&seqnum,0,0xdc,0);
  dbfile._0_4_ = 0;
  local_a0 = 100;
  while( true ) {
    iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x8ed);
      sequence_iterator_duplicate_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x8ed,"void sequence_iterator_duplicate_test()");
      }
    }
    if (local_a0 < 0x8c) {
      local_a0 = local_a0 + 2;
    }
    else {
      local_a0 = local_a0 + 1;
    }
    if (local_a0 < 0xc9) {
      n = (int)local_a0 - 0x65;
      sprintf((char *)&fconfig.num_blocks_readahead,"body%d(second)",(ulong)(uint)n);
    }
    else {
      uVar3 = (local_a0 - 0x65) % (ulong)(long)dbfile._4_4_ << 1;
      n = (int)uVar3;
      sprintf((char *)&fconfig.num_blocks_readahead,"body%d(third)",uVar3 & 0xffffffff);
    }
    iVar1 = memcmp((void *)psStack_88[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_88);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_88[4],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x8fb);
      sequence_iterator_duplicate_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x8fb,"void sequence_iterator_duplicate_test()");
    }
    iVar1 = memcmp((void *)psStack_88[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_88[1]);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_88[7],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x8fc);
      sequence_iterator_duplicate_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x8fc,"void sequence_iterator_duplicate_test()");
    }
    iVar1 = memcmp((void *)psStack_88[8],&fconfig.num_blocks_readahead,psStack_88[2]);
    if (iVar1 != 0) break;
    if (psStack_88[5] != local_a0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x8fe);
      sequence_iterator_duplicate_test::__test_pass = 0;
      if (psStack_88[5] != local_a0) {
        __assert_fail("rdoc->seqnum == seqnum",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x8fe,"void sequence_iterator_duplicate_test()");
      }
    }
    dbfile._0_4_ = (int)dbfile + 1;
    fdb_doc_free((fdb_doc *)0x11425e);
    psStack_88 = (size_t *)0x0;
    fVar2 = fdb_iterator_next((fdb_iterator *)in_stack_fffffffffffff7d8);
    if (fVar2 == FDB_RESULT_ITERATOR_FAIL) {
      if ((int)dbfile != dbfile._4_4_) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x904);
        sequence_iterator_duplicate_test::__test_pass = 0;
        if ((int)dbfile != dbfile._4_4_) {
          __assert_fail("count==n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0x904,"void sequence_iterator_duplicate_test()");
        }
      }
      fdb_iterator_close(in_stack_fffffffffffff7e8);
      fdb_kvs_close(in_stack_fffffffffffff7d8);
      fdb_close((fdb_file_handle *)in_stack_fffffffffffff7d8);
      for (n = 0; n < dbfile._4_4_; n = n + 1) {
        fdb_doc_free((fdb_doc *)0x11431a);
      }
      fdb_shutdown();
      memleak_end();
      if (sequence_iterator_duplicate_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","sequence iterator duplicate test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","sequence iterator duplicate test");
      }
      return;
    }
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",&fconfig.num_blocks_readahead,
          psStack_88[8],
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0x8fd);
  sequence_iterator_duplicate_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x8fd,"void sequence_iterator_duplicate_test()");
}

Assistant:

void sequence_iterator_duplicate_test()
{
    // Unit test for MB-12225
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 100;
    int count;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_seqnum_t seqnum;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1; // retain deletes until compaction

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "sequence_iterator_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents first time
    for (i=0;i<n;i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d(first)", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents second time
    for (i=0;i<n;i++){
        sprintf(bodybuf, "body%d(second)", i);
        fdb_doc_update(&doc[i], NULL, 0, bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents third time (only even number documents)
    for (i=0;i<n;i+=2){
        sprintf(bodybuf, "body%d(third)", i);
        fdb_doc_update(&doc[i], NULL, 0, bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without WAL flushing
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator over sequence number
    fdb_iterator_sequence_init(db, &iterator, 0, 220, FDB_ITR_NONE);

    // repeat until fail
    count = 0;
    seqnum = 100;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (seqnum < 140) { // point where WAL range & trie range overlap ends!
            seqnum += 2; // WAL overlap with trie, get unique trie keys only
        } else { // beyond this even keys in trie are also in WAL but outside..
            seqnum ++; // the iteration range, so they can be sequentially got
        }

        if (seqnum <= 200) { // uptil WAL, unique trie items are returned...
            i = seqnum - 101;
            sprintf(bodybuf, "body%d(second)", i);
        } else { // once seqnum enters WAL range only WAL elements are returned..
            i = ((seqnum - 101) % n) * 2;
            sprintf(bodybuf, "body%d(third)", i);
        }
        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        TEST_CHK(rdoc->seqnum == seqnum);

        count++;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count==n); // since 220 > n all keys should be iterated
    fdb_iterator_close(iterator);

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);
    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }
    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("sequence iterator duplicate test");
}